

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O2

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopyBeginTo
          (CordRepBtree *this,size_t end,size_t new_length)

{
  CordRepBtree *pCVar1;
  long lVar2;
  
  if (6 < end) {
    __assert_fail("end <= capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x2cb,
                  "CordRepBtree *absl::cord_internal::CordRepBtree::CopyBeginTo(size_t, size_t) const"
                 );
  }
  if ((this->super_CordRep).storage[1] <= end) {
    pCVar1 = CopyRaw(this,new_length);
    (pCVar1->super_CordRep).storage[2] = (uint8_t)end;
    for (lVar2 = (ulong)(pCVar1->super_CordRep).storage[1] << 3; end << 3 != lVar2;
        lVar2 = lVar2 + 8) {
      CordRep::Ref(*(CordRep **)((long)pCVar1->edges_ + lVar2));
    }
    return pCVar1;
  }
  __assert_fail("end >= this->begin()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x2cc,
                "CordRepBtree *absl::cord_internal::CordRepBtree::CopyBeginTo(size_t, size_t) const"
               );
}

Assistant:

inline CordRepBtree* CordRepBtree::CopyBeginTo(size_t end,
                                               size_t new_length) const {
  assert(end <= capacity());
  assert(end >= this->begin());
  CordRepBtree* tree = CopyRaw(new_length);
  tree->set_end(end);
  for (CordRep* edge : tree->Edges()) CordRep::Ref(edge);
  return tree;
}